

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

string * google::protobuf::compiler::python::
         NamePrefixedWithNestedTypes<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,EnumDescriptor *descriptor,string_view separator)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar1;
  DescriptorStringView psVar2;
  Descriptor *this;
  Descriptor *descriptor_00;
  char *in_R8;
  string_view name_00;
  string_view name_01;
  undefined1 auVar3 [16];
  string_view separator_00;
  string local_2a8;
  basic_string_view<char,_std::char_traits<char>_> local_288;
  Descriptor *local_278;
  char *local_270;
  AlphaNum local_268;
  Descriptor *local_238;
  char *pcStack_230;
  AlphaNum local_220;
  AlphaNum local_1f0;
  undefined4 local_1bc;
  AlphaNum local_1b8;
  AlphaNum local_188;
  AlphaNum local_158;
  AlphaNum local_128;
  AlphaNum local_f8;
  undefined1 local_c8 [16];
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_b8;
  Descriptor *local_a8;
  char *local_a0;
  Descriptor *local_98;
  char *pcStack_90;
  undefined1 local_80 [8];
  string prefix;
  Descriptor *parent;
  string name;
  EnumDescriptor *descriptor_local;
  string_view separator_local;
  
  separator_00._M_len = separator._M_str;
  descriptor_00 = (Descriptor *)separator._M_len;
  name.field_2._8_8_ = descriptor;
  psVar2 = EnumDescriptor::name_abi_cxx11_(descriptor);
  std::__cxx11::string::string((string *)&parent,(string *)psVar2);
  this = EnumDescriptor::containing_type((EnumDescriptor *)name.field_2._8_8_);
  if (this == (Descriptor *)0x0) {
    local_278 = descriptor_00;
    local_270 = separator_00._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_288,".");
    __x._M_str = local_270;
    __x._M_len = (size_t)local_278;
    __y._M_str = local_288._M_str;
    __y._M_len = local_288._M_len;
    bVar1 = std::operator==(__x,__y);
    if (bVar1) {
      auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&parent);
      name_01._M_len = auVar3._8_8_;
      name_01._M_str = local_288._M_str;
      ResolveKeyword_abi_cxx11_(&local_2a8,auVar3._0_8_,name_01);
      std::__cxx11::string::operator=((string *)&parent,(string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&parent);
    local_1bc = 1;
    goto LAB_004e6c82;
  }
  separator_00._M_str = in_R8;
  local_98 = descriptor_00;
  pcStack_90 = separator_00._M_len;
  NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
            ((string *)local_80,(python *)this,descriptor_00,separator_00);
  local_a8 = descriptor_00;
  local_a0 = separator_00._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,".");
  __x_00._M_str = local_a0;
  __x_00._M_len = (size_t)local_a8;
  bVar1 = std::operator==(__x_00,local_b8);
  if (bVar1) {
    local_c8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&parent);
    name_00._M_str = local_c8._8_8_;
    name_00._M_len = (size_t)name_00._M_str;
    bVar1 = IsPythonKeyword(local_c8._0_8_,name_00);
    if (!bVar1) goto LAB_004e6b43;
    absl::lts_20240722::AlphaNum::AlphaNum(&local_f8,"getattr(");
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_128,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_158,", \'");
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_188,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parent);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_1b8,"\')");
    absl::lts_20240722::StrCat<>
              (__return_storage_ptr__,&local_f8,&local_128,&local_158,&local_188,&local_1b8);
  }
  else {
LAB_004e6b43:
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_1f0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
    local_238 = descriptor_00;
    pcStack_230 = separator_00._M_len;
    absl::lts_20240722::AlphaNum::AlphaNum(&local_220,separator);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_268,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parent);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_1f0,&local_220);
  }
  local_1bc = 1;
  std::__cxx11::string::~string((string *)local_80);
LAB_004e6c82:
  std::__cxx11::string::~string((string *)&parent);
  return __return_storage_ptr__;
}

Assistant:

std::string NamePrefixedWithNestedTypes(const DescriptorT& descriptor,
                                        absl::string_view separator) {
  std::string name = std::string(descriptor.name());
  const Descriptor* parent = descriptor.containing_type();
  if (parent != nullptr) {
    std::string prefix = NamePrefixedWithNestedTypes(*parent, separator);
    if (separator == "." && IsPythonKeyword(name)) {
      return absl::StrCat("getattr(", prefix, ", '", name, "')");
    } else {
      return absl::StrCat(prefix, separator, name);
    }
  }
  if (separator == ".") {
    name = ResolveKeyword(name);
  }
  return name;
}